

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

void __thiscall
Wasm::WasmSignature::AllocateParams(WasmSignature *this,ArgSlot count,Recycler *recycler)

{
  ArgSlot AVar1;
  WasmCompilationException *this_00;
  Recycler *pRVar2;
  WasmType *ptr;
  TrackAllocData local_58;
  Recycler *local_20;
  Recycler *recycler_local;
  WasmSignature *pWStack_10;
  ArgSlot count_local;
  WasmSignature *this_local;
  
  local_20 = recycler;
  recycler_local._6_2_ = count;
  pWStack_10 = this;
  AVar1 = GetParamCount(this);
  pRVar2 = local_20;
  if (AVar1 != 0) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,
               L"Invalid call to WasmSignature::AllocateParams: Params are already allocated");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  if (recycler_local._6_2_ != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&WasmTypes::WasmType::typeinfo,0,(ulong)recycler_local._6_2_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
               ,0x1e);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_58);
    ptr = Memory::AllocateArray<Memory::Recycler,Wasm::WasmTypes::WasmType,false>
                    ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                     (ulong)recycler_local._6_2_);
    Memory::WriteBarrierPtr<Wasm::WasmTypes::WasmType>::operator=(&this->m_params,ptr);
  }
  this->m_paramsCount = recycler_local._6_2_;
  return;
}

Assistant:

void WasmSignature::AllocateParams(Js::ArgSlot count, Recycler * recycler)
{
    if (GetParamCount() != 0)
    {
        throw WasmCompilationException(_u("Invalid call to WasmSignature::AllocateParams: Params are already allocated"));
    }
    if (count > 0)
    {
        m_params = RecyclerNewArrayLeafZ(recycler, Local, count);
    }
    m_paramsCount = count;
}